

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalSavepointUndo(Wal *pWal,u32 *aWalData)

{
  int rc;
  u32 *aWalData_local;
  Wal *pWal_local;
  
  if (aWalData[3] != pWal->nCkpt) {
    *aWalData = 0;
    aWalData[3] = pWal->nCkpt;
  }
  if (*aWalData < (pWal->hdr).mxFrame) {
    (pWal->hdr).mxFrame = *aWalData;
    (pWal->hdr).aFrameCksum[0] = aWalData[1];
    (pWal->hdr).aFrameCksum[1] = aWalData[2];
    walCleanupHash(pWal);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalSavepointUndo(Wal *pWal, u32 *aWalData){
  int rc = SQLITE_OK;

  assert( pWal->writeLock );
  assert( aWalData[3]!=pWal->nCkpt || aWalData[0]<=pWal->hdr.mxFrame );

  if( aWalData[3]!=pWal->nCkpt ){
    /* This savepoint was opened immediately after the write-transaction
    ** was started. Right after that, the writer decided to wrap around
    ** to the start of the log. Update the savepoint values to match.
    */
    aWalData[0] = 0;
    aWalData[3] = pWal->nCkpt;
  }

  if( aWalData[0]<pWal->hdr.mxFrame ){
    pWal->hdr.mxFrame = aWalData[0];
    pWal->hdr.aFrameCksum[0] = aWalData[1];
    pWal->hdr.aFrameCksum[1] = aWalData[2];
    walCleanupHash(pWal);
  }

  return rc;
}